

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

void __thiscall MD5::print(MD5 *this)

{
  uint local_2c;
  byte local_28 [4];
  uint i;
  Digest digest_val;
  MD5 *this_local;
  
  digest(this,local_28);
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    printf("%02x",(ulong)local_28[local_2c]);
  }
  printf("\n");
  return;
}

Assistant:

void
MD5::print()
{
    Digest digest_val;
    digest(digest_val);

    unsigned int i;
    for (i = 0; i < 16; ++i) {
        printf("%02x", digest_val[i]);
    }
    printf("\n");
}